

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  byte bVar1;
  global_State *pgVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  TValue *pTVar7;
  CallInfo *pCVar8;
  StkId pTVar9;
  int *piVar10;
  CallInfo *pCVar11;
  uint uVar12;
  GCObject *pGVar13;
  StkId pTVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  StkId pTVar18;
  ulong uVar19;
  StkId pTVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar24 [16];
  
  iVar17 = func->tt;
  if ((long)iVar17 == 6) {
    pGVar13 = (func->value).gc;
  }
  else {
    pTVar7 = luaT_gettmbyobj(L,func,TM_CALL);
    if (pTVar7->tt != 6) {
      luaG_runerror(L,"attempt to %s a %s value","call",luaT_typenames[iVar17]);
    }
    pTVar9 = L->stack;
    pTVar14 = L->top;
    if (func < pTVar14) {
      do {
        pTVar14->value = pTVar14[-1].value;
        pTVar14->tt = pTVar14[-1].tt;
        pTVar14 = pTVar14 + -1;
      } while (func < pTVar14);
      pTVar14 = L->top;
    }
    if ((long)L->stack_last - (long)pTVar14 < 0x11) {
      iVar17 = L->stacksize;
      iVar25 = iVar17 * 2;
      if (iVar17 < 1) {
        iVar25 = iVar17 + 1;
      }
      luaD_reallocstack(L,iVar25);
      pTVar14 = L->top;
    }
    lVar21 = (long)func - (long)pTVar9;
    L->top = pTVar14 + 1;
    pTVar14 = L->stack;
    pGVar13 = (pTVar7->value).gc;
    *(GCObject **)((long)pTVar14 + lVar21) = pGVar13;
    *(int *)((long)pTVar14 + lVar21 + 8) = pTVar7->tt;
    func = (StkId)(lVar21 + (long)pTVar14);
  }
  pTVar14 = L->stack;
  lVar21 = (long)func - (long)pTVar14;
  pCVar8 = L->ci;
  pCVar8->savedpc = L->savedpc;
  if ((pGVar13->h).flags == '\0') {
    pgVar2 = (pGVar13->th).l_G;
    bVar1 = *(byte *)((long)&pgVar2->GCthreshold + 3);
    if ((long)L->stack_last - (long)L->top <= (long)((ulong)bVar1 * 0x10)) {
      iVar17 = L->stacksize;
      iVar25 = iVar17 * 2;
      if (iVar17 < (int)(uint)bVar1) {
        iVar25 = iVar17 + (uint)bVar1;
      }
      luaD_reallocstack(L,iVar25);
      pTVar14 = L->stack;
    }
    pTVar9 = (StkId)((long)pTVar14 + lVar21);
    if (*(char *)((long)&pgVar2->GCthreshold + 2) == '\0') {
      pTVar20 = pTVar9 + 1;
      if (pTVar9 + (ulong)*(byte *)((long)&pgVar2->GCthreshold + 1) + 1 < L->top) {
        L->top = pTVar9 + (ulong)*(byte *)((long)&pgVar2->GCthreshold + 1) + 1;
      }
    }
    else {
      pTVar20 = L->top;
      bVar1 = *(byte *)((long)&pgVar2->GCthreshold + 1);
      uVar6 = (uint)bVar1;
      iVar17 = (int)((ulong)((long)pTVar20 - (long)pTVar9) >> 4);
      if ((int)(uint)bVar1 < iVar17) {
        uVar12 = iVar17 - 1;
      }
      else {
        iVar17 = (uVar6 - iVar17) + 1;
        do {
          pTVar20->tt = 0;
          pTVar20 = pTVar20 + 1;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
        L->top = pTVar20;
        uVar12 = uVar6;
      }
      if (uVar6 != 0) {
        lVar15 = 0;
        do {
          pTVar14 = L->top;
          L->top = pTVar14 + 1;
          pTVar14->value = *(Value *)((long)&pTVar20[-(ulong)uVar12].value + lVar15);
          pTVar14->tt = *(int *)((long)&pTVar20[-(ulong)uVar12].tt + lVar15);
          *(undefined4 *)((long)&pTVar20[-(ulong)uVar12].tt + lVar15) = 0;
          lVar15 = lVar15 + 0x10;
        } while ((ulong)bVar1 << 4 != lVar15);
        pTVar14 = L->stack;
      }
      pTVar9 = (StkId)((long)pTVar14 + lVar21);
    }
    if (L->ci == L->end_ci) {
      pCVar8 = growCI(L);
    }
    else {
      pCVar8 = L->ci + 1;
      L->ci = pCVar8;
    }
    pCVar8->func = pTVar9;
    pCVar8->base = pTVar20;
    L->base = pTVar20;
    bVar1 = *(byte *)((long)&pgVar2->GCthreshold + 3);
    pTVar9 = pTVar20 + bVar1;
    pCVar8->top = pTVar9;
    L->savedpc = (Instruction *)pgVar2->ud;
    pCVar8->tailcalls = 0;
    pCVar8->nresults = nresults;
    auVar5 = _DAT_00115030;
    auVar4 = _DAT_00115020;
    auVar3 = _DAT_00115010;
    pTVar14 = L->top;
    if (pTVar14 < pTVar9) {
      pTVar18 = pTVar20 + bVar1;
      if (pTVar20 + bVar1 <= pTVar14 + 1) {
        pTVar18 = pTVar14 + 1;
      }
      uVar16 = (long)&pTVar18->value + ~(ulong)pTVar14;
      auVar24._8_4_ = (int)uVar16;
      auVar24._0_8_ = uVar16;
      auVar24._12_4_ = (int)(uVar16 >> 0x20);
      auVar22._0_8_ = uVar16 >> 4;
      auVar22._8_8_ = auVar24._8_8_ >> 4;
      piVar10 = &pTVar14[3].tt;
      uVar19 = 0;
      auVar22 = auVar22 ^ _DAT_00115030;
      do {
        auVar23._8_4_ = (int)uVar19;
        auVar23._0_8_ = uVar19;
        auVar23._12_4_ = (int)(uVar19 >> 0x20);
        auVar24 = (auVar23 | auVar4) ^ auVar5;
        iVar17 = auVar22._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar17 && auVar22._0_4_ < auVar24._0_4_ ||
                    iVar17 < auVar24._4_4_) & 1)) {
          piVar10[-0xc] = 0;
        }
        if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
            auVar24._12_4_ <= auVar22._12_4_) {
          piVar10[-8] = 0;
        }
        auVar24 = (auVar23 | auVar3) ^ auVar5;
        iVar25 = auVar24._4_4_;
        if (iVar25 <= iVar17 && (iVar25 != iVar17 || auVar24._0_4_ <= auVar22._0_4_)) {
          piVar10[-4] = 0;
          *piVar10 = 0;
        }
        uVar19 = uVar19 + 4;
        piVar10 = piVar10 + 0x10;
      } while (((uVar16 >> 4) + 4 & 0xfffffffffffffffc) != uVar19);
    }
    L->top = pTVar9;
    iVar17 = 0;
  }
  else {
    if ((long)L->stack_last - (long)L->top < 0x141) {
      iVar17 = L->stacksize;
      iVar25 = iVar17 * 2;
      if (iVar17 < 0x14) {
        iVar25 = iVar17 + 0x14;
      }
      luaD_reallocstack(L,iVar25);
      pCVar8 = L->ci;
    }
    if (pCVar8 == L->end_ci) {
      pCVar8 = growCI(L);
      pCVar11 = L->ci;
    }
    else {
      pCVar8 = pCVar8 + 1;
      L->ci = pCVar8;
      pCVar11 = pCVar8;
    }
    pTVar14 = L->stack;
    pCVar8->func = (StkId)((long)pTVar14 + lVar21);
    pTVar14 = (StkId)((long)pTVar14 + lVar21 + 0x10);
    pCVar8->base = pTVar14;
    L->base = pTVar14;
    pCVar8->top = L->top + 0x14;
    pCVar8->nresults = nresults;
    uVar6 = (*(code *)(((pCVar11->func->value).gc)->h).node)(L);
    if ((int)uVar6 < 0) {
      iVar17 = 2;
    }
    else {
      luaD_poscall(L,L->top + -(ulong)uVar6);
      iVar17 = 1;
    }
  }
  return iVar17;
}

Assistant:

static int luaD_precall(lua_State*L,StkId func,int nresults){
LClosure*cl;
ptrdiff_t funcr;
if(!ttisfunction(func))
func=tryfuncTM(L,func);
funcr=savestack(L,func);
cl=&clvalue(func)->l;
L->ci->savedpc=L->savedpc;
if(!cl->isC){
CallInfo*ci;
StkId st,base;
Proto*p=cl->p;
luaD_checkstack(L,p->maxstacksize);
func=restorestack(L,funcr);
if(!p->is_vararg){
base=func+1;
if(L->top>base+p->numparams)
L->top=base+p->numparams;
}
else{
int nargs=cast_int(L->top-func)-1;
base=adjust_varargs(L,p,nargs);
func=restorestack(L,funcr);
}
ci=inc_ci(L);
ci->func=func;
L->base=ci->base=base;
ci->top=L->base+p->maxstacksize;
L->savedpc=p->code;
ci->tailcalls=0;
ci->nresults=nresults;
for(st=L->top;st<ci->top;st++)
setnilvalue(st);
L->top=ci->top;
return 0;
}
else{
CallInfo*ci;
int n;
luaD_checkstack(L,20);
ci=inc_ci(L);
ci->func=restorestack(L,funcr);
L->base=ci->base=ci->func+1;
ci->top=L->top+20;
ci->nresults=nresults;
n=(*curr_func(L)->c.f)(L);
if(n<0)
return 2;
else{
luaD_poscall(L,L->top-n);
return 1;
}
}
}